

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAM.cpp
# Opt level: O0

RealType __thiscall
OpenMD::EAM::PhiCoreCore(EAM *this,RealType r,RealType re,RealType A,RealType alpha,RealType kappa)

{
  long in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  RealType RVar2;
  double in_XMM1_Qa;
  EAM *in_XMM2_Qa;
  undefined4 in_XMM3_Da;
  undefined4 in_XMM3_Db;
  RealType sigma;
  RealType a;
  undefined8 in_stack_ffffffffffffff98;
  RealType in_stack_ffffffffffffffa0;
  EAM *in_stack_ffffffffffffffa8;
  undefined8 local_8;
  
  if (*(int *)(in_RDI + 0xf8) == 3) {
    dVar1 = exp(-(double)CONCAT44(in_XMM3_Db,in_XMM3_Da) * (in_XMM0_Qa / in_XMM1_Qa - 1.0));
    RVar2 = fastPower(in_XMM2_Qa,dVar1,0x3f947ae1);
    local_8 = (double)in_XMM2_Qa * dVar1 + RVar2 * 0.02;
  }
  else if ((*(int *)(in_RDI + 0xf8) == 2) || (*(int *)(in_RDI + 0xf8) == 0)) {
    dVar1 = exp(-(double)CONCAT44(in_XMM3_Db,in_XMM3_Da) * (in_XMM0_Qa / in_XMM1_Qa - 1.0));
    RVar2 = fastPower(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                      (int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    local_8 = ((double)in_XMM2_Qa * dVar1) / (RVar2 + 1.0);
  }
  else {
    local_8 = 0.0;
  }
  return local_8;
}

Assistant:

RealType EAM::PhiCoreCore(RealType r, RealType re, RealType A, RealType alpha,
                            RealType kappa) {
    if (mixMeth_ == eamDream2) {
      RealType a     = 0.02;
      RealType sigma = 1;
      return (A * exp(-alpha * (r / re - 1.0)) +
              a * fastPower(sigma / (r + 1e-5), 30));
    }

    else if ((mixMeth_ == eamDream1) || (mixMeth_ == eamJohnson)) {
      return (A * exp(-alpha * (r / re - 1.0))) /
             (1.0 + fastPower(r / re - kappa, 20));
    }

    else
      return 0;
  }